

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

bool __thiscall Jupiter::IRC::Client::readConfigBool(Client *this,string_view key,bool defaultValue)

{
  bool bVar1;
  byte bVar2;
  Jupiter *this_00;
  const_iterator cVar4;
  char *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  Jupiter *pJVar3;
  
  if (this->m_primary_section != (Config *)0x0) {
    sVar5 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0));
    in_string._M_str = sVar5._M_str;
    this_00 = (Jupiter *)sVar5._M_len;
    pJVar3 = this_00;
    if (this_00 != (Jupiter *)0x0) {
      in_string._M_len = (size_t)in_string._M_str;
      bVar1 = asBool<char>(this_00,in_string);
      pJVar3 = (Jupiter *)(ulong)bVar1;
    }
    bVar2 = (byte)pJVar3;
    if (this_00 != (Jupiter *)0x0) goto LAB_0012dd52;
  }
  bVar2 = defaultValue;
  if ((this->m_secondary_section != (Config *)0x0) &&
     (local_38._M_len = key._M_len, local_38._M_str = key._M_str,
     cVar4 = std::
             _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                       ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&this->m_secondary_section->m_table,&local_38),
     cVar4.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
     ._M_cur != (__node_type *)0x0)) {
    in_string_00._M_str = extraout_RDX;
    in_string_00._M_len =
         *(size_t *)
          ((long)cVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    bVar2 = asBool<char>(*(Jupiter **)
                          ((long)cVar4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur + 0x30),in_string_00);
  }
LAB_0012dd52:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Jupiter::IRC::Client::readConfigBool(std::string_view key, bool defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<bool>(val);
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get<bool>(key, defaultValue);
	}

	return defaultValue;
}